

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  uint uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar30;
  undefined8 in_R9;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar51 [16];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  float fVar93;
  undefined4 uVar94;
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float t1;
  undefined1 auVar100 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vfloat4 b0;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vfloat4 a0_3;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  vfloat4 a0_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar195;
  float fVar197;
  vfloat4 a0_1;
  float fVar199;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar212;
  float fVar213;
  vfloat4 a0;
  undefined1 auVar205 [16];
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  undefined4 local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar222 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  fVar203 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar74._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar101 = fVar203 * auVar74._16_4_;
  fVar93 = fVar203 * (ray->dir).field_0.m128[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar62 = vpmovsxbd_avx2(auVar36);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar60 = vpmovsxbd_avx2(auVar46);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar67 = vpmovsxbd_avx2(auVar45);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar77 = vpmovsxbd_avx2(auVar44);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar28 * 0xc + 6);
  auVar78 = vpmovsxbd_avx2(auVar43);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar28 * 0xd + 6);
  auVar61 = vpmovsxbd_avx2(auVar42);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar28 * 0x12 + 6);
  auVar68 = vpmovsxbd_avx2(auVar41);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar28 * 0x13 + 6);
  auVar69 = vpmovsxbd_avx2(auVar40);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar28 * 0x14 + 6);
  auVar71 = vpmovsxbd_avx2(auVar37);
  auVar70 = vcvtdq2ps_avx(auVar71);
  auVar137._4_4_ = fVar93;
  auVar137._0_4_ = fVar93;
  auVar137._8_4_ = fVar93;
  auVar137._12_4_ = fVar93;
  auVar137._16_4_ = fVar93;
  auVar137._20_4_ = fVar93;
  auVar137._24_4_ = fVar93;
  auVar137._28_4_ = fVar93;
  auVar228._8_4_ = 1;
  auVar228._0_8_ = 0x100000001;
  auVar228._12_4_ = 1;
  auVar228._16_4_ = 1;
  auVar228._20_4_ = 1;
  auVar228._24_4_ = 1;
  auVar228._28_4_ = 1;
  auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar59 = ZEXT1632(CONCAT412(fVar203 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar203 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar203 * (ray->dir).field_0.m128[1],fVar93))));
  auVar72 = vpermps_avx2(auVar228,auVar59);
  auVar58 = vpermps_avx512vl(auVar57,auVar59);
  fVar93 = auVar58._0_4_;
  auVar229._0_4_ = fVar93 * auVar67._0_4_;
  fVar196 = auVar58._4_4_;
  auVar229._4_4_ = fVar196 * auVar67._4_4_;
  fVar198 = auVar58._8_4_;
  auVar229._8_4_ = fVar198 * auVar67._8_4_;
  fVar200 = auVar58._12_4_;
  auVar229._12_4_ = fVar200 * auVar67._12_4_;
  fVar201 = auVar58._16_4_;
  auVar229._16_4_ = fVar201 * auVar67._16_4_;
  fVar202 = auVar58._20_4_;
  auVar229._20_4_ = fVar202 * auVar67._20_4_;
  fVar99 = auVar58._24_4_;
  auVar229._28_36_ = in_ZMM4._28_36_;
  auVar229._24_4_ = fVar99 * auVar67._24_4_;
  auVar59._4_4_ = auVar61._4_4_ * fVar196;
  auVar59._0_4_ = auVar61._0_4_ * fVar93;
  auVar59._8_4_ = auVar61._8_4_ * fVar198;
  auVar59._12_4_ = auVar61._12_4_ * fVar200;
  auVar59._16_4_ = auVar61._16_4_ * fVar201;
  auVar59._20_4_ = auVar61._20_4_ * fVar202;
  auVar59._24_4_ = auVar61._24_4_ * fVar99;
  auVar59._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar70._4_4_ * fVar196;
  auVar71._0_4_ = auVar70._0_4_ * fVar93;
  auVar71._8_4_ = auVar70._8_4_ * fVar198;
  auVar71._12_4_ = auVar70._12_4_ * fVar200;
  auVar71._16_4_ = auVar70._16_4_ * fVar201;
  auVar71._20_4_ = auVar70._20_4_ * fVar202;
  auVar71._24_4_ = auVar70._24_4_ * fVar99;
  auVar71._28_4_ = auVar58._28_4_;
  auVar36 = vfmadd231ps_fma(auVar229._0_32_,auVar72,auVar60);
  auVar46 = vfmadd231ps_fma(auVar59,auVar72,auVar78);
  auVar45 = vfmadd231ps_fma(auVar71,auVar69,auVar72);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar137,auVar62);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar137,auVar77);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar68,auVar137);
  auVar218._4_4_ = fVar101;
  auVar218._0_4_ = fVar101;
  auVar218._8_4_ = fVar101;
  auVar218._12_4_ = fVar101;
  auVar218._16_4_ = fVar101;
  auVar218._20_4_ = fVar101;
  auVar218._24_4_ = fVar101;
  auVar218._28_4_ = fVar101;
  auVar72 = ZEXT1632(CONCAT412(fVar203 * auVar74._28_4_,
                               CONCAT48(fVar203 * auVar74._24_4_,
                                        CONCAT44(fVar203 * auVar74._20_4_,fVar101))));
  auVar71 = vpermps_avx2(auVar228,auVar72);
  auVar59 = vpermps_avx512vl(auVar57,auVar72);
  fVar203 = auVar59._0_4_;
  fVar93 = auVar59._4_4_;
  auVar72._4_4_ = fVar93 * auVar67._4_4_;
  auVar72._0_4_ = fVar203 * auVar67._0_4_;
  fVar196 = auVar59._8_4_;
  auVar72._8_4_ = fVar196 * auVar67._8_4_;
  fVar198 = auVar59._12_4_;
  auVar72._12_4_ = fVar198 * auVar67._12_4_;
  fVar200 = auVar59._16_4_;
  auVar72._16_4_ = fVar200 * auVar67._16_4_;
  fVar201 = auVar59._20_4_;
  auVar72._20_4_ = fVar201 * auVar67._20_4_;
  fVar202 = auVar59._24_4_;
  auVar72._24_4_ = fVar202 * auVar67._24_4_;
  auVar72._28_4_ = 1;
  auVar57._4_4_ = auVar61._4_4_ * fVar93;
  auVar57._0_4_ = auVar61._0_4_ * fVar203;
  auVar57._8_4_ = auVar61._8_4_ * fVar196;
  auVar57._12_4_ = auVar61._12_4_ * fVar198;
  auVar57._16_4_ = auVar61._16_4_ * fVar200;
  auVar57._20_4_ = auVar61._20_4_ * fVar201;
  auVar57._24_4_ = auVar61._24_4_ * fVar202;
  auVar57._28_4_ = auVar67._28_4_;
  auVar61._4_4_ = auVar70._4_4_ * fVar93;
  auVar61._0_4_ = auVar70._0_4_ * fVar203;
  auVar61._8_4_ = auVar70._8_4_ * fVar196;
  auVar61._12_4_ = auVar70._12_4_ * fVar198;
  auVar61._16_4_ = auVar70._16_4_ * fVar200;
  auVar61._20_4_ = auVar70._20_4_ * fVar201;
  auVar61._24_4_ = auVar70._24_4_ * fVar202;
  auVar61._28_4_ = auVar59._28_4_;
  auVar44 = vfmadd231ps_fma(auVar72,auVar71,auVar60);
  auVar43 = vfmadd231ps_fma(auVar57,auVar71,auVar78);
  auVar42 = vfmadd231ps_fma(auVar61,auVar71,auVar69);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar218,auVar62);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar218,auVar77);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar80._16_4_ = 0x7fffffff;
  auVar80._20_4_ = 0x7fffffff;
  auVar80._24_4_ = 0x7fffffff;
  auVar80._28_4_ = 0x7fffffff;
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar218,auVar68);
  auVar62 = vandps_avx(ZEXT1632(auVar36),auVar80);
  auVar124._8_4_ = 0x219392ef;
  auVar124._0_8_ = 0x219392ef219392ef;
  auVar124._12_4_ = 0x219392ef;
  auVar124._16_4_ = 0x219392ef;
  auVar124._20_4_ = 0x219392ef;
  auVar124._24_4_ = 0x219392ef;
  auVar124._28_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar62,auVar124,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar58._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._12_4_;
  auVar58._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar58._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar58._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar58._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar46),auVar80);
  uVar29 = vcmpps_avx512vl(auVar62,auVar124,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar73._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar45),auVar80);
  uVar29 = vcmpps_avx512vl(auVar62,auVar124,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar62._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar60 = vrcp14ps_avx512vl(auVar58);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar58,auVar60,auVar81);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar73);
  auVar46 = vfnmadd213ps_fma(auVar73,auVar60,auVar81);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar62);
  auVar45 = vfnmadd213ps_fma(auVar62,auVar60,auVar81);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar60,auVar60);
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar44));
  auVar68._4_4_ = auVar36._4_4_ * auVar62._4_4_;
  auVar68._0_4_ = auVar36._0_4_ * auVar62._0_4_;
  auVar68._8_4_ = auVar36._8_4_ * auVar62._8_4_;
  auVar68._12_4_ = auVar36._12_4_ * auVar62._12_4_;
  auVar68._16_4_ = auVar62._16_4_ * 0.0;
  auVar68._20_4_ = auVar62._20_4_ * 0.0;
  auVar68._24_4_ = auVar62._24_4_ * 0.0;
  auVar68._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar44));
  auVar79._0_4_ = auVar36._0_4_ * auVar62._0_4_;
  auVar79._4_4_ = auVar36._4_4_ * auVar62._4_4_;
  auVar79._8_4_ = auVar36._8_4_ * auVar62._8_4_;
  auVar79._12_4_ = auVar36._12_4_ * auVar62._12_4_;
  auVar79._16_4_ = auVar62._16_4_ * 0.0;
  auVar79._20_4_ = auVar62._20_4_ * 0.0;
  auVar79._24_4_ = auVar62._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0xe + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar43));
  auVar69._4_4_ = auVar46._4_4_ * auVar62._4_4_;
  auVar69._0_4_ = auVar46._0_4_ * auVar62._0_4_;
  auVar69._8_4_ = auVar46._8_4_ * auVar62._8_4_;
  auVar69._12_4_ = auVar46._12_4_ * auVar62._12_4_;
  auVar69._16_4_ = auVar62._16_4_ * 0.0;
  auVar69._20_4_ = auVar62._20_4_ * 0.0;
  auVar69._24_4_ = auVar62._24_4_ * 0.0;
  auVar69._28_4_ = auVar62._28_4_;
  auVar61 = vpbroadcastd_avx512vl();
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar43));
  auVar76._0_4_ = auVar46._0_4_ * auVar62._0_4_;
  auVar76._4_4_ = auVar46._4_4_ * auVar62._4_4_;
  auVar76._8_4_ = auVar46._8_4_ * auVar62._8_4_;
  auVar76._12_4_ = auVar46._12_4_ * auVar62._12_4_;
  auVar76._16_4_ = auVar62._16_4_ * 0.0;
  auVar76._20_4_ = auVar62._20_4_ * 0.0;
  auVar76._24_4_ = auVar62._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x15 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar42));
  auVar70._4_4_ = auVar62._4_4_ * auVar45._4_4_;
  auVar70._0_4_ = auVar62._0_4_ * auVar45._0_4_;
  auVar70._8_4_ = auVar62._8_4_ * auVar45._8_4_;
  auVar70._12_4_ = auVar62._12_4_ * auVar45._12_4_;
  auVar70._16_4_ = auVar62._16_4_ * 0.0;
  auVar70._20_4_ = auVar62._20_4_ * 0.0;
  auVar70._24_4_ = auVar62._24_4_ * 0.0;
  auVar70._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar42));
  auVar75._0_4_ = auVar45._0_4_ * auVar62._0_4_;
  auVar75._4_4_ = auVar45._4_4_ * auVar62._4_4_;
  auVar75._8_4_ = auVar45._8_4_ * auVar62._8_4_;
  auVar75._12_4_ = auVar45._12_4_ * auVar62._12_4_;
  auVar75._16_4_ = auVar62._16_4_ * 0.0;
  auVar75._20_4_ = auVar62._20_4_ * 0.0;
  auVar75._24_4_ = auVar62._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar62 = vpminsd_avx2(auVar68,auVar79);
  auVar60 = vpminsd_avx2(auVar69,auVar76);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60 = vpminsd_avx2(auVar70,auVar75);
  uVar94 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar67._4_4_ = uVar94;
  auVar67._0_4_ = uVar94;
  auVar67._8_4_ = uVar94;
  auVar67._12_4_ = uVar94;
  auVar67._16_4_ = uVar94;
  auVar67._20_4_ = uVar94;
  auVar67._24_4_ = uVar94;
  auVar67._28_4_ = uVar94;
  auVar60 = vmaxps_avx512vl(auVar60,auVar67);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  auVar60._16_4_ = 0x3f7ffffa;
  auVar60._20_4_ = 0x3f7ffffa;
  auVar60._24_4_ = 0x3f7ffffa;
  auVar60._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar62,auVar60);
  auVar62 = vpmaxsd_avx2(auVar68,auVar79);
  auVar60 = vpmaxsd_avx2(auVar69,auVar76);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar60 = vpmaxsd_avx2(auVar70,auVar75);
  fVar203 = ray->tfar;
  auVar77._4_4_ = fVar203;
  auVar77._0_4_ = fVar203;
  auVar77._8_4_ = fVar203;
  auVar77._12_4_ = fVar203;
  auVar77._16_4_ = fVar203;
  auVar77._20_4_ = fVar203;
  auVar77._24_4_ = fVar203;
  auVar77._28_4_ = fVar203;
  auVar60 = vminps_avx512vl(auVar60,auVar77);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar78._8_4_ = 0x3f800003;
  auVar78._0_8_ = 0x3f8000033f800003;
  auVar78._12_4_ = 0x3f800003;
  auVar78._16_4_ = 0x3f800003;
  auVar78._20_4_ = 0x3f800003;
  auVar78._24_4_ = 0x3f800003;
  auVar78._28_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar78);
  uVar9 = vcmpps_avx512vl(local_78,auVar62,2);
  uVar10 = vpcmpgtd_avx512vl(auVar61,_DAT_01fb4ba0);
  uVar29 = CONCAT44((int)((ulong)in_R9 >> 0x20),(uint)(byte)((byte)uVar9 & (byte)uVar10));
  auVar74._16_16_ = auVar62._16_16_;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar36);
  auVar238 = ZEXT464(0x3f800000);
  local_250 = prim;
LAB_019c029b:
  if (uVar29 == 0) {
LAB_019c1cf7:
    return uVar29 != 0;
  }
  lVar24 = 0;
  for (uVar28 = uVar29; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  local_310 = (ulong)*(uint *)(local_250 + 2);
  local_258 = (ulong)*(uint *)(local_250 + lVar24 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_258);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar36 = *(undefined1 (*) [16])(_Var8 + uVar27 * (long)pvVar7);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (uVar27 + 1) * (long)pvVar7);
  auVar45 = *(undefined1 (*) [16])(_Var8 + (uVar27 + 2) * (long)pvVar7);
  auVar44 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar27 + 3));
  lVar24 = *(long *)&pGVar5[1].time_range.upper;
  auVar43 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * uVar27);
  auVar42 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 1));
  auVar41 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 2));
  uVar28 = uVar29 - 1 & uVar29;
  auVar40 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 3));
  if (uVar28 != 0) {
    uVar30 = uVar28 - 1 & uVar28;
    for (uVar27 = uVar28; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar30 != 0) {
      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar37 = vmulps_avx512vl(auVar40,auVar64._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar64._0_16_);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar38);
  auVar50._0_4_ = auVar43._0_4_ + auVar37._0_4_;
  auVar50._4_4_ = auVar43._4_4_ + auVar37._4_4_;
  auVar50._8_4_ = auVar43._8_4_ + auVar37._8_4_;
  auVar50._12_4_ = auVar43._12_4_ + auVar37._12_4_;
  auVar49 = auVar239._0_16_;
  auVar37 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar49);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar43,auVar49);
  auVar37 = vmulps_avx512vl(auVar44,auVar64._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar37,auVar45,auVar64._0_16_);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar46,auVar39);
  auVar205._0_4_ = auVar36._0_4_ + auVar37._0_4_;
  auVar205._4_4_ = auVar36._4_4_ + auVar37._4_4_;
  auVar205._8_4_ = auVar36._8_4_ + auVar37._8_4_;
  auVar205._12_4_ = auVar36._12_4_ + auVar37._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar49);
  auVar39 = vfnmadd231ps_avx512vl(auVar37,auVar36,auVar49);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar40);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar64._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar64._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar49);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar49,auVar41);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar42);
  auVar41 = vfnmadd231ps_avx512vl(auVar42,auVar64._0_16_,auVar43);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar45,auVar44);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar64._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar36,auVar64._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar49);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar49,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar45,auVar64._0_16_,auVar46);
  auVar42 = vfnmadd231ps_avx512vl(auVar46,auVar64._0_16_,auVar36);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar46 = vshufps_avx(auVar205,auVar205,0xc9);
  fVar200 = auVar38._0_4_;
  auVar126._0_4_ = fVar200 * auVar46._0_4_;
  fVar201 = auVar38._4_4_;
  auVar126._4_4_ = fVar201 * auVar46._4_4_;
  fVar202 = auVar38._8_4_;
  auVar126._8_4_ = fVar202 * auVar46._8_4_;
  fVar99 = auVar38._12_4_;
  auVar126._12_4_ = fVar99 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar126,auVar36,auVar205);
  auVar45 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar127._0_4_ = fVar200 * auVar46._0_4_;
  auVar127._4_4_ = fVar201 * auVar46._4_4_;
  auVar127._8_4_ = fVar202 * auVar46._8_4_;
  auVar127._12_4_ = fVar99 * auVar46._12_4_;
  auVar36 = vfmsub231ps_fma(auVar127,auVar36,auVar39);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar46 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar101 = auVar41._0_4_;
  auVar118._0_4_ = fVar101 * auVar46._0_4_;
  fVar115 = auVar41._4_4_;
  auVar118._4_4_ = fVar115 * auVar46._4_4_;
  fVar116 = auVar41._8_4_;
  auVar118._8_4_ = fVar116 * auVar46._8_4_;
  fVar117 = auVar41._12_4_;
  auVar118._12_4_ = fVar117 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar118,auVar36,auVar43);
  auVar43 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar157._0_4_ = auVar46._0_4_ * fVar101;
  auVar157._4_4_ = auVar46._4_4_ * fVar115;
  auVar157._8_4_ = auVar46._8_4_ * fVar116;
  auVar157._12_4_ = auVar46._12_4_ * fVar117;
  auVar36 = vfmsub231ps_fma(auVar157,auVar36,auVar42);
  auVar42 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar203 = auVar36._0_4_;
  auVar64._16_16_ = auVar74._16_16_;
  auVar63._4_28_ = auVar64._4_28_;
  auVar63._0_4_ = fVar203;
  auVar46 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  fVar93 = auVar46._0_4_;
  fVar196 = fVar93 * 1.5 - fVar203 * 0.5 * fVar93 * fVar93 * fVar93;
  auVar46 = vdpps_avx(auVar45,auVar44,0x7f);
  fVar204 = fVar196 * auVar45._0_4_;
  fVar212 = fVar196 * auVar45._4_4_;
  fVar213 = fVar196 * auVar45._8_4_;
  fVar214 = fVar196 * auVar45._12_4_;
  auVar165._0_4_ = auVar44._0_4_ * fVar203;
  auVar165._4_4_ = auVar44._4_4_ * fVar203;
  auVar165._8_4_ = auVar44._8_4_ * fVar203;
  auVar165._12_4_ = auVar44._12_4_ * fVar203;
  fVar203 = auVar46._0_4_;
  auVar140._0_4_ = fVar203 * auVar45._0_4_;
  auVar140._4_4_ = fVar203 * auVar45._4_4_;
  auVar140._8_4_ = fVar203 * auVar45._8_4_;
  auVar140._12_4_ = fVar203 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar165,auVar140);
  auVar46 = vrcp14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar46,ZEXT416(0x40000000));
  fVar203 = auVar46._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar43,auVar43,0x7f);
  fVar93 = auVar36._0_4_;
  auVar66._16_16_ = auVar74._16_16_;
  auVar66._0_16_ = auVar64._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = fVar93;
  auVar46 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  fVar198 = auVar46._0_4_;
  fVar198 = fVar198 * 1.5 - fVar93 * 0.5 * fVar198 * fVar198 * fVar198;
  auVar46 = vdpps_avx(auVar43,auVar42,0x7f);
  fVar184 = fVar198 * auVar43._0_4_;
  fVar195 = fVar198 * auVar43._4_4_;
  fVar197 = fVar198 * auVar43._8_4_;
  fVar199 = fVar198 * auVar43._12_4_;
  auVar128._0_4_ = fVar93 * auVar42._0_4_;
  auVar128._4_4_ = fVar93 * auVar42._4_4_;
  auVar128._8_4_ = fVar93 * auVar42._8_4_;
  auVar128._12_4_ = fVar93 * auVar42._12_4_;
  fVar93 = auVar46._0_4_;
  auVar119._0_4_ = fVar93 * auVar43._0_4_;
  auVar119._4_4_ = fVar93 * auVar43._4_4_;
  auVar119._8_4_ = fVar93 * auVar43._8_4_;
  auVar119._12_4_ = fVar93 * auVar43._12_4_;
  auVar44 = vsubps_avx(auVar128,auVar119);
  auVar46 = vrcp14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar46,ZEXT416(0x40000000));
  fVar93 = auVar46._0_4_ * auVar36._0_4_;
  auVar36 = vshufps_avx(auVar50,auVar50,0xff);
  auVar147._0_4_ = fVar204 * auVar36._0_4_;
  auVar147._4_4_ = fVar212 * auVar36._4_4_;
  auVar147._8_4_ = fVar213 * auVar36._8_4_;
  auVar147._12_4_ = fVar214 * auVar36._12_4_;
  local_1a8 = vsubps_avx(auVar50,auVar147);
  auVar46 = vshufps_avx(auVar38,auVar38,0xff);
  auVar129._0_4_ = auVar46._0_4_ * fVar204 + auVar36._0_4_ * fVar196 * auVar45._0_4_ * fVar203;
  auVar129._4_4_ = auVar46._4_4_ * fVar212 + auVar36._4_4_ * fVar196 * auVar45._4_4_ * fVar203;
  auVar129._8_4_ = auVar46._8_4_ * fVar213 + auVar36._8_4_ * fVar196 * auVar45._8_4_ * fVar203;
  auVar129._12_4_ = auVar46._12_4_ * fVar214 + auVar36._12_4_ * fVar196 * auVar45._12_4_ * fVar203;
  auVar45 = vsubps_avx(auVar38,auVar129);
  local_1b8._0_4_ = auVar50._0_4_ + auVar147._0_4_;
  local_1b8._4_4_ = auVar50._4_4_ + auVar147._4_4_;
  fStack_1b0 = auVar50._8_4_ + auVar147._8_4_;
  fStack_1ac = auVar50._12_4_ + auVar147._12_4_;
  auVar36 = vshufps_avx(auVar37,auVar37,0xff);
  auVar130._0_4_ = fVar184 * auVar36._0_4_;
  auVar130._4_4_ = fVar195 * auVar36._4_4_;
  auVar130._8_4_ = fVar197 * auVar36._8_4_;
  auVar130._12_4_ = fVar199 * auVar36._12_4_;
  local_1c8 = vsubps_avx(auVar37,auVar130);
  auVar46 = vshufps_avx(auVar41,auVar41,0xff);
  auVar51._0_4_ = fVar184 * auVar46._0_4_ + auVar36._0_4_ * fVar198 * auVar44._0_4_ * fVar93;
  auVar51._4_4_ = fVar195 * auVar46._4_4_ + auVar36._4_4_ * fVar198 * auVar44._4_4_ * fVar93;
  auVar51._8_4_ = fVar197 * auVar46._8_4_ + auVar36._8_4_ * fVar198 * auVar44._8_4_ * fVar93;
  auVar51._12_4_ = fVar199 * auVar46._12_4_ + auVar36._12_4_ * fVar198 * auVar44._12_4_ * fVar93;
  auVar36 = vsubps_avx(auVar41,auVar51);
  _local_1d8 = vaddps_avx512vl(auVar37,auVar130);
  auVar48._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar48._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar48._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar48._12_4_ = auVar45._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar48);
  auVar53._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar53._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar53._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar53._12_4_ = auVar36._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar53);
  auVar39._0_4_ = (fVar200 + auVar129._0_4_) * 0.33333334;
  auVar39._4_4_ = (fVar201 + auVar129._4_4_) * 0.33333334;
  auVar39._8_4_ = (fVar202 + auVar129._8_4_) * 0.33333334;
  auVar39._12_4_ = (fVar99 + auVar129._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar39);
  auVar49._0_4_ = (fVar101 + auVar51._0_4_) * 0.33333334;
  auVar49._4_4_ = (fVar115 + auVar51._4_4_) * 0.33333334;
  auVar49._8_4_ = (fVar116 + auVar51._8_4_) * 0.33333334;
  auVar49._12_4_ = (fVar117 + auVar51._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar49);
  aVar1 = (ray->org).field_0;
  auVar46 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar56._4_4_ = uVar94;
  auVar56._0_4_ = uVar94;
  auVar56._8_4_ = uVar94;
  auVar56._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar203 = (pre->ray_space).vz.field_0.m128[0];
  fVar93 = (pre->ray_space).vz.field_0.m128[1];
  fVar196 = (pre->ray_space).vz.field_0.m128[2];
  fVar198 = (pre->ray_space).vz.field_0.m128[3];
  auVar52._0_4_ = fVar203 * auVar46._0_4_;
  auVar52._4_4_ = fVar93 * auVar46._4_4_;
  auVar52._8_4_ = fVar196 * auVar46._8_4_;
  auVar52._12_4_ = fVar198 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar3,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar56);
  auVar46 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar54._4_4_ = uVar94;
  auVar54._0_4_ = uVar94;
  auVar54._8_4_ = uVar94;
  auVar54._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar47._0_4_ = fVar203 * auVar46._0_4_;
  auVar47._4_4_ = fVar93 * auVar46._4_4_;
  auVar47._8_4_ = fVar196 * auVar46._8_4_;
  auVar47._12_4_ = fVar198 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar3,auVar36);
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar54);
  auVar46 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar148._4_4_ = uVar94;
  auVar148._0_4_ = uVar94;
  auVar148._8_4_ = uVar94;
  auVar148._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar55._0_4_ = fVar203 * auVar46._0_4_;
  auVar55._4_4_ = fVar93 * auVar46._4_4_;
  auVar55._8_4_ = fVar196 * auVar46._8_4_;
  auVar55._12_4_ = fVar198 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar148);
  auVar46 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar158._4_4_ = uVar94;
  auVar158._0_4_ = uVar94;
  auVar158._8_4_ = uVar94;
  auVar158._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar149._0_4_ = fVar203 * auVar46._0_4_;
  auVar149._4_4_ = fVar93 * auVar46._4_4_;
  auVar149._8_4_ = fVar196 * auVar46._8_4_;
  auVar149._12_4_ = fVar198 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar3,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar158);
  auVar46 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar166._4_4_ = uVar94;
  auVar166._0_4_ = uVar94;
  auVar166._8_4_ = uVar94;
  auVar166._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar159._0_4_ = auVar46._0_4_ * fVar203;
  auVar159._4_4_ = auVar46._4_4_ * fVar93;
  auVar159._8_4_ = auVar46._8_4_ * fVar196;
  auVar159._12_4_ = auVar46._12_4_ * fVar198;
  auVar36 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar3,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar166);
  auVar46 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar177._4_4_ = uVar94;
  auVar177._0_4_ = uVar94;
  auVar177._8_4_ = uVar94;
  auVar177._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar167._0_4_ = auVar46._0_4_ * fVar203;
  auVar167._4_4_ = auVar46._4_4_ * fVar93;
  auVar167._8_4_ = auVar46._8_4_ * fVar196;
  auVar167._12_4_ = auVar46._12_4_ * fVar198;
  auVar36 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar3,auVar36);
  auVar74._16_16_ = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar177);
  auVar46 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar185._4_4_ = uVar94;
  auVar185._0_4_ = uVar94;
  auVar185._8_4_ = uVar94;
  auVar185._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar178._0_4_ = auVar46._0_4_ * fVar203;
  auVar178._4_4_ = auVar46._4_4_ * fVar93;
  auVar178._8_4_ = auVar46._8_4_ * fVar196;
  auVar178._12_4_ = auVar46._12_4_ * fVar198;
  auVar36 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar185);
  auVar46 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar94 = auVar46._0_4_;
  auVar186._4_4_ = uVar94;
  auVar186._0_4_ = uVar94;
  auVar186._8_4_ = uVar94;
  auVar186._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar120._0_4_ = fVar203 * auVar46._0_4_;
  auVar120._4_4_ = fVar93 * auVar46._4_4_;
  auVar120._8_4_ = fVar196 * auVar46._8_4_;
  auVar120._12_4_ = fVar198 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar3,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar186);
  local_308 = vmovlhps_avx512f(auVar43,auVar37);
  auVar235 = ZEXT1664(local_308);
  local_268 = vmovlhps_avx(auVar42,auVar74._16_16_);
  local_278 = vmovlhps_avx512f(auVar41,auVar38);
  _local_108 = vmovlhps_avx512f(auVar40,auVar39);
  auVar36 = vminps_avx512vl(local_308,local_268);
  auVar45 = vmaxps_avx512vl(local_308,local_268);
  auVar46 = vminps_avx512vl(local_278,_local_108);
  auVar46 = vminps_avx(auVar36,auVar46);
  auVar36 = vmaxps_avx512vl(local_278,_local_108);
  auVar36 = vmaxps_avx(auVar45,auVar36);
  auVar45 = vshufpd_avx(auVar46,auVar46,3);
  auVar44 = vshufpd_avx(auVar36,auVar36,3);
  auVar46 = vminps_avx(auVar46,auVar45);
  auVar36 = vmaxps_avx(auVar36,auVar44);
  auVar46 = vandps_avx512vl(auVar46,auVar229._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar229._0_16_);
  auVar36 = vmaxps_avx(auVar46,auVar36);
  auVar46 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar46,auVar36);
  local_288._8_8_ = auVar43._0_8_;
  local_288._0_8_ = auVar43._0_8_;
  local_298 = vmovddup_avx512vl(auVar42);
  local_2a8 = vmovddup_avx512vl(auVar41);
  local_2b8._0_8_ = auVar40._0_8_;
  local_2b8._8_8_ = local_2b8._0_8_;
  register0x00001348 = auVar37._0_8_;
  local_2c8 = auVar37._0_8_;
  register0x00001388 = auVar74._16_8_;
  local_2d8 = auVar74._16_8_;
  register0x00001408 = auVar38._0_8_;
  local_2e8 = auVar38._0_8_;
  register0x00001448 = auVar39._0_8_;
  local_2f8 = auVar39._0_8_;
  local_118 = ZEXT416((uint)(auVar36._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar36 = vxorps_avx512vl(local_b8._0_16_,auVar230._0_16_);
  local_d8 = vbroadcastss_avx512vl(auVar36);
  local_328 = vsubps_avx512vl(local_268,local_308);
  local_e8 = vsubps_avx512vl(local_278,local_268);
  local_f8 = vsubps_avx512vl(_local_108,local_278);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar31 = false;
  auVar36 = ZEXT816(0x3f80000000000000);
  uVar27 = 0;
  auVar38 = auVar36;
LAB_019c095c:
  auVar237 = ZEXT3264(local_b8);
  auVar46 = vshufps_avx(auVar38,auVar38,0x50);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar222._16_4_ = 0x3f800000;
  auVar222._0_16_ = auVar219;
  auVar222._20_4_ = 0x3f800000;
  auVar222._24_4_ = 0x3f800000;
  auVar222._28_4_ = 0x3f800000;
  auVar45 = vsubps_avx(auVar219,auVar46);
  fVar203 = auVar46._0_4_;
  auVar121._0_4_ = local_2c8._0_4_ * fVar203;
  fVar93 = auVar46._4_4_;
  auVar121._4_4_ = local_2c8._4_4_ * fVar93;
  fVar196 = auVar46._8_4_;
  auVar121._8_4_ = local_2c8._8_4_ * fVar196;
  fVar198 = auVar46._12_4_;
  auVar121._12_4_ = local_2c8._12_4_ * fVar198;
  auVar131._0_4_ = local_2d8._0_4_ * fVar203;
  auVar131._4_4_ = local_2d8._4_4_ * fVar93;
  auVar131._8_4_ = local_2d8._8_4_ * fVar196;
  auVar131._12_4_ = local_2d8._12_4_ * fVar198;
  auVar141._0_4_ = local_2e8._0_4_ * fVar203;
  auVar141._4_4_ = local_2e8._4_4_ * fVar93;
  auVar141._8_4_ = local_2e8._8_4_ * fVar196;
  auVar141._12_4_ = local_2e8._12_4_ * fVar198;
  auVar102._0_4_ = local_2f8._0_4_ * fVar203;
  auVar102._4_4_ = local_2f8._4_4_ * fVar93;
  auVar102._8_4_ = local_2f8._8_4_ * fVar196;
  auVar102._12_4_ = local_2f8._12_4_ * fVar198;
  auVar44 = vfmadd231ps_fma(auVar121,auVar45,local_288);
  auVar43 = vfmadd231ps_avx512vl(auVar131,auVar45,local_298);
  auVar42 = vfmadd231ps_avx512vl(auVar141,auVar45,local_2a8);
  auVar45 = vfmadd231ps_fma(auVar102,local_2b8,auVar45);
  auVar46 = vmovshdup_avx(auVar36);
  fVar93 = auVar36._0_4_;
  fVar203 = (auVar46._0_4_ - fVar93) * 0.04761905;
  auVar164._4_4_ = fVar93;
  auVar164._0_4_ = fVar93;
  auVar164._8_4_ = fVar93;
  auVar164._12_4_ = fVar93;
  auVar164._16_4_ = fVar93;
  auVar164._20_4_ = fVar93;
  auVar164._24_4_ = fVar93;
  auVar164._28_4_ = fVar93;
  auVar113._0_8_ = auVar46._0_8_;
  auVar113._8_8_ = auVar113._0_8_;
  auVar113._16_8_ = auVar113._0_8_;
  auVar113._24_8_ = auVar113._0_8_;
  auVar62 = vsubps_avx(auVar113,auVar164);
  uVar94 = auVar44._0_4_;
  auVar114._4_4_ = uVar94;
  auVar114._0_4_ = uVar94;
  auVar114._8_4_ = uVar94;
  auVar114._12_4_ = uVar94;
  auVar114._16_4_ = uVar94;
  auVar114._20_4_ = uVar94;
  auVar114._24_4_ = uVar94;
  auVar114._28_4_ = uVar94;
  auVar181._8_4_ = 1;
  auVar181._0_8_ = 0x100000001;
  auVar181._12_4_ = 1;
  auVar181._16_4_ = 1;
  auVar181._20_4_ = 1;
  auVar181._24_4_ = 1;
  auVar181._28_4_ = 1;
  auVar77 = ZEXT1632(auVar44);
  auVar60 = vpermps_avx2(auVar181,auVar77);
  auVar67 = vbroadcastss_avx512vl(auVar43);
  auVar78 = ZEXT1632(auVar43);
  auVar61 = vpermps_avx512vl(auVar181,auVar78);
  auVar68 = vbroadcastss_avx512vl(auVar42);
  auVar75 = ZEXT1632(auVar42);
  auVar69 = vpermps_avx512vl(auVar181,auVar75);
  auVar70 = vbroadcastss_avx512vl(auVar45);
  auVar74 = ZEXT1632(auVar45);
  auVar71 = vpermps_avx512vl(auVar181,auVar74);
  auVar182._4_4_ = fVar203;
  auVar182._0_4_ = fVar203;
  auVar182._8_4_ = fVar203;
  auVar182._12_4_ = fVar203;
  auVar182._16_4_ = fVar203;
  auVar182._20_4_ = fVar203;
  auVar182._24_4_ = fVar203;
  auVar182._28_4_ = fVar203;
  auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar59 = vpermps_avx512vl(auVar72,auVar77);
  auVar156._8_4_ = 3;
  auVar156._0_8_ = 0x300000003;
  auVar156._12_4_ = 3;
  auVar156._16_4_ = 3;
  auVar156._20_4_ = 3;
  auVar156._24_4_ = 3;
  auVar156._28_4_ = 3;
  auVar57 = vpermps_avx512vl(auVar156,auVar77);
  auVar58 = vpermps_avx512vl(auVar72,auVar78);
  auVar77 = vpermps_avx2(auVar156,auVar78);
  auVar73 = vpermps_avx512vl(auVar72,auVar75);
  auVar78 = vpermps_avx2(auVar156,auVar75);
  auVar72 = vpermps_avx512vl(auVar72,auVar74);
  auVar74 = vpermps_avx512vl(auVar156,auVar74);
  auVar46 = vfmadd132ps_fma(auVar62,auVar164,_DAT_01f7b040);
  auVar62 = vsubps_avx(auVar222,ZEXT1632(auVar46));
  auVar75 = vmulps_avx512vl(auVar67,ZEXT1632(auVar46));
  auVar79 = ZEXT1632(auVar46);
  auVar76 = vmulps_avx512vl(auVar61,auVar79);
  auVar45 = vfmadd231ps_fma(auVar75,auVar62,auVar114);
  auVar44 = vfmadd231ps_fma(auVar76,auVar62,auVar60);
  auVar75 = vmulps_avx512vl(auVar68,auVar79);
  auVar76 = vmulps_avx512vl(auVar69,auVar79);
  auVar67 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar67);
  auVar61 = vfmadd231ps_avx512vl(auVar76,auVar62,auVar61);
  auVar75 = vmulps_avx512vl(auVar70,auVar79);
  auVar76 = ZEXT1632(auVar46);
  auVar71 = vmulps_avx512vl(auVar71,auVar76);
  auVar68 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar68);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar69);
  fVar196 = auVar46._0_4_;
  fVar198 = auVar46._4_4_;
  auVar15._4_4_ = fVar198 * auVar67._4_4_;
  auVar15._0_4_ = fVar196 * auVar67._0_4_;
  fVar200 = auVar46._8_4_;
  auVar15._8_4_ = fVar200 * auVar67._8_4_;
  fVar201 = auVar46._12_4_;
  auVar15._12_4_ = fVar201 * auVar67._12_4_;
  auVar15._16_4_ = auVar67._16_4_ * 0.0;
  auVar15._20_4_ = auVar67._20_4_ * 0.0;
  auVar15._24_4_ = auVar67._24_4_ * 0.0;
  auVar15._28_4_ = fVar93;
  auVar16._4_4_ = fVar198 * auVar61._4_4_;
  auVar16._0_4_ = fVar196 * auVar61._0_4_;
  auVar16._8_4_ = fVar200 * auVar61._8_4_;
  auVar16._12_4_ = fVar201 * auVar61._12_4_;
  auVar16._16_4_ = auVar61._16_4_ * 0.0;
  auVar16._20_4_ = auVar61._20_4_ * 0.0;
  auVar16._24_4_ = auVar61._24_4_ * 0.0;
  auVar16._28_4_ = auVar60._28_4_;
  auVar45 = vfmadd231ps_fma(auVar15,auVar62,ZEXT1632(auVar45));
  auVar44 = vfmadd231ps_fma(auVar16,auVar62,ZEXT1632(auVar44));
  auVar107._0_4_ = fVar196 * auVar68._0_4_;
  auVar107._4_4_ = fVar198 * auVar68._4_4_;
  auVar107._8_4_ = fVar200 * auVar68._8_4_;
  auVar107._12_4_ = fVar201 * auVar68._12_4_;
  auVar107._16_4_ = auVar68._16_4_ * 0.0;
  auVar107._20_4_ = auVar68._20_4_ * 0.0;
  auVar107._24_4_ = auVar68._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar17._4_4_ = fVar198 * auVar69._4_4_;
  auVar17._0_4_ = fVar196 * auVar69._0_4_;
  auVar17._8_4_ = fVar200 * auVar69._8_4_;
  auVar17._12_4_ = fVar201 * auVar69._12_4_;
  auVar17._16_4_ = auVar69._16_4_ * 0.0;
  auVar17._20_4_ = auVar69._20_4_ * 0.0;
  auVar17._24_4_ = auVar69._24_4_ * 0.0;
  auVar17._28_4_ = auVar68._28_4_;
  auVar43 = vfmadd231ps_fma(auVar107,auVar62,auVar67);
  auVar42 = vfmadd231ps_fma(auVar17,auVar62,auVar61);
  auVar18._28_4_ = auVar61._28_4_;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(fVar201 * auVar42._12_4_,
                          CONCAT48(fVar200 * auVar42._8_4_,
                                   CONCAT44(fVar198 * auVar42._4_4_,fVar196 * auVar42._0_4_))));
  auVar41 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar201 * auVar43._12_4_,
                                               CONCAT48(fVar200 * auVar43._8_4_,
                                                        CONCAT44(fVar198 * auVar43._4_4_,
                                                                 fVar196 * auVar43._0_4_)))),auVar62
                            ,ZEXT1632(auVar45));
  auVar40 = vfmadd231ps_fma(auVar18,auVar62,ZEXT1632(auVar44));
  auVar60 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar45));
  auVar67 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar44));
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar60 = vmulps_avx512vl(auVar60,auVar61);
  auVar67 = vmulps_avx512vl(auVar67,auVar61);
  auVar176._0_4_ = fVar203 * auVar60._0_4_;
  auVar176._4_4_ = fVar203 * auVar60._4_4_;
  auVar176._8_4_ = fVar203 * auVar60._8_4_;
  auVar176._12_4_ = fVar203 * auVar60._12_4_;
  auVar176._16_4_ = fVar203 * auVar60._16_4_;
  auVar176._20_4_ = fVar203 * auVar60._20_4_;
  auVar176._24_4_ = fVar203 * auVar60._24_4_;
  auVar176._28_4_ = 0;
  auVar60 = vmulps_avx512vl(auVar182,auVar67);
  auVar44 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
  auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01fb9fc0,ZEXT1632(auVar44));
  auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01fb9fc0,ZEXT1632(auVar44));
  auVar108._0_4_ = auVar176._0_4_ + auVar41._0_4_;
  auVar108._4_4_ = auVar176._4_4_ + auVar41._4_4_;
  auVar108._8_4_ = auVar176._8_4_ + auVar41._8_4_;
  auVar108._12_4_ = auVar176._12_4_ + auVar41._12_4_;
  auVar108._16_4_ = auVar176._16_4_ + 0.0;
  auVar108._20_4_ = auVar176._20_4_ + 0.0;
  auVar108._24_4_ = auVar176._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar79 = ZEXT1632(auVar44);
  auVar69 = vpermt2ps_avx512vl(auVar176,_DAT_01fb9fc0,auVar79);
  auVar70 = vaddps_avx512vl(ZEXT1632(auVar40),auVar60);
  auVar71 = vpermt2ps_avx512vl(auVar60,_DAT_01fb9fc0,auVar79);
  auVar60 = vsubps_avx(auVar67,auVar69);
  auVar69 = vsubps_avx512vl(auVar68,auVar71);
  auVar71 = vmulps_avx512vl(auVar58,auVar76);
  auVar75 = vmulps_avx512vl(auVar77,auVar76);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar59);
  auVar59 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar57);
  auVar57 = vmulps_avx512vl(auVar73,auVar76);
  auVar75 = vmulps_avx512vl(auVar78,auVar76);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar58);
  auVar77 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar77);
  auVar72 = vmulps_avx512vl(auVar72,auVar76);
  auVar58 = vmulps_avx512vl(auVar74,auVar76);
  auVar45 = vfmadd231ps_fma(auVar72,auVar62,auVar73);
  auVar72 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar78);
  auVar58 = vmulps_avx512vl(auVar76,auVar57);
  auVar74 = ZEXT1632(auVar46);
  auVar73 = vmulps_avx512vl(auVar74,auVar77);
  auVar71 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar71);
  auVar59 = vfmadd231ps_avx512vl(auVar73,auVar62,auVar59);
  auVar72 = vmulps_avx512vl(auVar74,auVar72);
  auVar57 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar201 * auVar45._12_4_,
                                          CONCAT48(fVar200 * auVar45._8_4_,
                                                   CONCAT44(fVar198 * auVar45._4_4_,
                                                            fVar196 * auVar45._0_4_)))),auVar62,
                       auVar57);
  auVar77 = vfmadd231ps_avx512vl(auVar72,auVar62,auVar77);
  auVar19._4_4_ = fVar198 * auVar57._4_4_;
  auVar19._0_4_ = fVar196 * auVar57._0_4_;
  auVar19._8_4_ = fVar200 * auVar57._8_4_;
  auVar19._12_4_ = fVar201 * auVar57._12_4_;
  auVar19._16_4_ = auVar57._16_4_ * 0.0;
  auVar19._20_4_ = auVar57._20_4_ * 0.0;
  auVar19._24_4_ = auVar57._24_4_ * 0.0;
  auVar19._28_4_ = auVar78._28_4_;
  auVar78 = vmulps_avx512vl(auVar74,auVar77);
  auVar72 = vfmadd231ps_avx512vl(auVar19,auVar62,auVar71);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar59,auVar62);
  auVar62 = vsubps_avx512vl(auVar57,auVar71);
  auVar77 = vsubps_avx512vl(auVar77,auVar59);
  auVar62 = vmulps_avx512vl(auVar62,auVar61);
  auVar77 = vmulps_avx512vl(auVar77,auVar61);
  fVar93 = fVar203 * auVar62._0_4_;
  fVar196 = fVar203 * auVar62._4_4_;
  auVar20._4_4_ = fVar196;
  auVar20._0_4_ = fVar93;
  fVar198 = fVar203 * auVar62._8_4_;
  auVar20._8_4_ = fVar198;
  fVar200 = fVar203 * auVar62._12_4_;
  auVar20._12_4_ = fVar200;
  fVar201 = fVar203 * auVar62._16_4_;
  auVar20._16_4_ = fVar201;
  fVar202 = fVar203 * auVar62._20_4_;
  auVar20._20_4_ = fVar202;
  fVar203 = fVar203 * auVar62._24_4_;
  auVar20._24_4_ = fVar203;
  auVar20._28_4_ = auVar62._28_4_;
  auVar77 = vmulps_avx512vl(auVar182,auVar77);
  auVar61 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar79);
  auVar71 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar79);
  auVar183._0_4_ = auVar72._0_4_ + fVar93;
  auVar183._4_4_ = auVar72._4_4_ + fVar196;
  auVar183._8_4_ = auVar72._8_4_ + fVar198;
  auVar183._12_4_ = auVar72._12_4_ + fVar200;
  auVar183._16_4_ = auVar72._16_4_ + fVar201;
  auVar183._20_4_ = auVar72._20_4_ + fVar202;
  auVar183._24_4_ = auVar72._24_4_ + fVar203;
  auVar183._28_4_ = auVar72._28_4_ + auVar62._28_4_;
  auVar62 = vpermt2ps_avx512vl(auVar20,_DAT_01fb9fc0,ZEXT1632(auVar44));
  auVar59 = vaddps_avx512vl(auVar78,auVar77);
  auVar77 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,ZEXT1632(auVar44));
  auVar62 = vsubps_avx(auVar61,auVar62);
  auVar77 = vsubps_avx512vl(auVar71,auVar77);
  in_ZMM17 = ZEXT3264(auVar77);
  auVar124 = ZEXT1632(auVar41);
  auVar57 = vsubps_avx512vl(auVar72,auVar124);
  auVar137 = ZEXT1632(auVar40);
  auVar58 = vsubps_avx512vl(auVar78,auVar137);
  auVar73 = vsubps_avx512vl(auVar61,auVar67);
  auVar57 = vaddps_avx512vl(auVar57,auVar73);
  auVar73 = vsubps_avx512vl(auVar71,auVar68);
  auVar58 = vaddps_avx512vl(auVar58,auVar73);
  auVar73 = vmulps_avx512vl(auVar137,auVar57);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar124,auVar58);
  auVar74 = vmulps_avx512vl(auVar70,auVar57);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar108,auVar58);
  auVar75 = vmulps_avx512vl(auVar69,auVar57);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar60,auVar58);
  auVar76 = vmulps_avx512vl(auVar68,auVar57);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar67,auVar58);
  auVar79 = vmulps_avx512vl(auVar78,auVar57);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar72,auVar58);
  auVar80 = vmulps_avx512vl(auVar59,auVar57);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar183,auVar58);
  auVar81 = vmulps_avx512vl(auVar77,auVar57);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar62,auVar58);
  auVar57 = vmulps_avx512vl(auVar71,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar61,auVar58);
  auVar58 = vminps_avx512vl(auVar73,auVar74);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar58 = vminps_avx512vl(auVar58,auVar74);
  auVar74 = vmaxps_avx512vl(auVar75,auVar76);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar79,auVar80);
  auVar75 = vmaxps_avx512vl(auVar79,auVar80);
  auVar76 = vminps_avx512vl(auVar81,auVar57);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar58 = vminps_avx512vl(auVar58,auVar74);
  auVar57 = vmaxps_avx512vl(auVar81,auVar57);
  auVar57 = vmaxps_avx512vl(auVar75,auVar57);
  auVar57 = vmaxps_avx512vl(auVar73,auVar57);
  uVar9 = vcmpps_avx512vl(auVar58,local_b8,2);
  uVar10 = vcmpps_avx512vl(auVar57,local_d8,5);
  bVar21 = (byte)uVar9 & (byte)uVar10 & 0x7f;
  if (bVar21 != 0) {
    auVar57 = vsubps_avx512vl(auVar67,auVar124);
    auVar58 = vsubps_avx512vl(auVar68,auVar137);
    auVar73 = vsubps_avx512vl(auVar61,auVar72);
    auVar57 = vaddps_avx512vl(auVar57,auVar73);
    auVar73 = vsubps_avx512vl(auVar71,auVar78);
    auVar58 = vaddps_avx512vl(auVar58,auVar73);
    auVar73 = vmulps_avx512vl(auVar137,auVar57);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar58,auVar124);
    auVar70 = vmulps_avx512vl(auVar70,auVar57);
    auVar70 = vfnmadd213ps_avx512vl(auVar108,auVar58,auVar70);
    auVar69 = vmulps_avx512vl(auVar69,auVar57);
    auVar69 = vfnmadd213ps_avx512vl(auVar60,auVar58,auVar69);
    auVar60 = vmulps_avx512vl(auVar68,auVar57);
    auVar68 = vfnmadd231ps_avx512vl(auVar60,auVar58,auVar67);
    auVar60 = vmulps_avx512vl(auVar78,auVar57);
    auVar78 = vfnmadd231ps_avx512vl(auVar60,auVar58,auVar72);
    auVar60 = vmulps_avx512vl(auVar59,auVar57);
    auVar72 = vfnmadd213ps_avx512vl(auVar183,auVar58,auVar60);
    auVar60 = vmulps_avx512vl(auVar77,auVar57);
    auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar58,auVar60);
    auVar62 = vmulps_avx512vl(auVar71,auVar57);
    auVar61 = vfnmadd231ps_avx512vl(auVar62,auVar61,auVar58);
    auVar60 = vminps_avx(auVar73,auVar70);
    auVar62 = vmaxps_avx(auVar73,auVar70);
    auVar67 = vminps_avx(auVar69,auVar68);
    auVar67 = vminps_avx(auVar60,auVar67);
    auVar60 = vmaxps_avx(auVar69,auVar68);
    auVar62 = vmaxps_avx(auVar62,auVar60);
    auVar77 = vminps_avx(auVar78,auVar72);
    auVar60 = vmaxps_avx(auVar78,auVar72);
    auVar78 = vminps_avx(auVar59,auVar61);
    auVar77 = vminps_avx(auVar77,auVar78);
    auVar77 = vminps_avx(auVar67,auVar77);
    auVar67 = vmaxps_avx(auVar59,auVar61);
    auVar60 = vmaxps_avx(auVar60,auVar67);
    auVar62 = vmaxps_avx(auVar62,auVar60);
    uVar9 = vcmpps_avx512vl(auVar62,local_d8,5);
    uVar10 = vcmpps_avx512vl(auVar77,local_b8,2);
    bVar21 = bVar21 & (byte)uVar9 & (byte)uVar10;
    if (bVar21 != 0) {
      auStack_198[uVar27] = (uint)bVar21;
      uVar9 = vmovlps_avx(auVar36);
      (&uStack_98)[uVar27] = uVar9;
      uVar30 = vmovlps_avx(auVar38);
      auStack_58[uVar27] = uVar30;
      uVar27 = (ulong)((int)uVar27 + 1);
    }
  }
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar36);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT3264(auVar62);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar232 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar233 = ZEXT1664(auVar36);
  auVar234 = ZEXT3264(_DAT_01fb9fe0);
  auVar74._16_16_ = DAT_01fb9fe0._16_16_;
  auVar236 = ZEXT1664(local_328);
LAB_019c0e59:
  do {
    do {
      do {
        auVar46 = auVar239._0_16_;
        if ((int)uVar27 == 0) {
          if (bVar31) goto LAB_019c1cf7;
          fVar203 = ray->tfar;
          auVar14._4_4_ = fVar203;
          auVar14._0_4_ = fVar203;
          auVar14._8_4_ = fVar203;
          auVar14._12_4_ = fVar203;
          auVar14._16_4_ = fVar203;
          auVar14._20_4_ = fVar203;
          auVar14._24_4_ = fVar203;
          auVar14._28_4_ = fVar203;
          uVar9 = vcmpps_avx512vl(local_78,auVar14,2);
          uVar29 = (ulong)((uint)uVar28 & (uint)uVar9);
          goto LAB_019c029b;
        }
        uVar22 = (int)uVar27 - 1;
        uVar23 = (ulong)uVar22;
        uVar4 = auStack_198[uVar23];
        auVar38._8_8_ = 0;
        auVar38._0_8_ = auStack_58[uVar23];
        uVar30 = 0;
        for (uVar26 = (ulong)uVar4; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar30 = uVar30 + 1;
        }
        uVar25 = uVar4 - 1 & uVar4;
        bVar34 = uVar25 == 0;
        auStack_198[uVar23] = uVar25;
        if (bVar34) {
          uVar27 = (ulong)uVar22;
        }
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar30;
        auVar36 = vpunpcklqdq_avx(auVar95,ZEXT416((int)uVar30 + 1));
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar232._0_16_);
        uVar94 = *(undefined4 *)((long)&uStack_98 + uVar23 * 8 + 4);
        auVar11._4_4_ = uVar94;
        auVar11._0_4_ = uVar94;
        auVar11._8_4_ = uVar94;
        auVar11._12_4_ = uVar94;
        auVar45 = vmulps_avx512vl(auVar36,auVar11);
        auVar44 = auVar233._0_16_;
        auVar36 = vsubps_avx512vl(auVar44,auVar36);
        uVar94 = *(undefined4 *)(&uStack_98 + uVar23);
        auVar12._4_4_ = uVar94;
        auVar12._0_4_ = uVar94;
        auVar12._8_4_ = uVar94;
        auVar12._12_4_ = uVar94;
        auVar36 = vfmadd231ps_avx512vl(auVar45,auVar36,auVar12);
        auVar45 = vmovshdup_avx(auVar36);
        fVar203 = auVar45._0_4_ - auVar36._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar203));
        if (uVar4 == 0 || bVar34) goto LAB_019c095c;
        auVar45 = vshufps_avx(auVar38,auVar38,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar203));
        auVar41 = vsubps_avx512vl(auVar44,auVar45);
        fVar93 = auVar45._0_4_;
        auVar132._0_4_ = fVar93 * (float)local_2c8._0_4_;
        fVar196 = auVar45._4_4_;
        auVar132._4_4_ = fVar196 * (float)local_2c8._4_4_;
        fVar198 = auVar45._8_4_;
        auVar132._8_4_ = fVar198 * fStack_2c0;
        fVar200 = auVar45._12_4_;
        auVar132._12_4_ = fVar200 * fStack_2bc;
        auVar142._0_4_ = fVar93 * (float)local_2d8._0_4_;
        auVar142._4_4_ = fVar196 * (float)local_2d8._4_4_;
        auVar142._8_4_ = fVar198 * fStack_2d0;
        auVar142._12_4_ = fVar200 * fStack_2cc;
        auVar150._0_4_ = fVar93 * (float)local_2e8._0_4_;
        auVar150._4_4_ = fVar196 * (float)local_2e8._4_4_;
        auVar150._8_4_ = fVar198 * fStack_2e0;
        auVar150._12_4_ = fVar200 * fStack_2dc;
        auVar109._0_4_ = fVar93 * (float)local_2f8._0_4_;
        auVar109._4_4_ = fVar196 * (float)local_2f8._4_4_;
        auVar109._8_4_ = fVar198 * fStack_2f0;
        auVar109._12_4_ = fVar200 * fStack_2ec;
        auVar45 = vfmadd231ps_fma(auVar132,auVar41,local_288);
        auVar43 = vfmadd231ps_fma(auVar142,auVar41,local_298);
        auVar42 = vfmadd231ps_fma(auVar150,auVar41,local_2a8);
        auVar41 = vfmadd231ps_fma(auVar109,auVar41,local_2b8);
        auVar125._16_16_ = auVar45;
        auVar125._0_16_ = auVar45;
        auVar138._16_16_ = auVar43;
        auVar138._0_16_ = auVar43;
        auVar146._16_16_ = auVar42;
        auVar146._0_16_ = auVar42;
        auVar60 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar36));
        auVar62 = vsubps_avx(auVar138,auVar125);
        auVar43 = vfmadd213ps_fma(auVar62,auVar60,auVar125);
        auVar62 = vsubps_avx(auVar146,auVar138);
        auVar40 = vfmadd213ps_fma(auVar62,auVar60,auVar138);
        auVar45 = vsubps_avx(auVar41,auVar42);
        auVar139._16_16_ = auVar45;
        auVar139._0_16_ = auVar45;
        auVar45 = vfmadd213ps_fma(auVar139,auVar60,auVar146);
        auVar62 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43));
        auVar43 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar43));
        auVar62 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar40));
        auVar45 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar40));
        auVar62 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar43));
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar62,auVar60);
        auVar62 = vmulps_avx512vl(auVar62,auVar231._0_32_);
        auVar74._16_16_ = auVar62._16_16_;
        auVar45 = vmulss_avx512f(ZEXT416((uint)fVar203),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar93 = auVar45._0_4_;
        auVar151._0_8_ =
             CONCAT44(auVar56._4_4_ + fVar93 * auVar62._4_4_,auVar56._0_4_ + fVar93 * auVar62._0_4_)
        ;
        auVar151._8_4_ = auVar56._8_4_ + fVar93 * auVar62._8_4_;
        auVar151._12_4_ = auVar56._12_4_ + fVar93 * auVar62._12_4_;
        auVar133._0_4_ = fVar93 * auVar62._16_4_;
        auVar133._4_4_ = fVar93 * auVar62._20_4_;
        auVar133._8_4_ = fVar93 * auVar62._24_4_;
        auVar133._12_4_ = fVar93 * auVar62._28_4_;
        auVar52 = vsubps_avx((undefined1  [16])0x0,auVar133);
        auVar40 = vshufpd_avx(auVar56,auVar56,3);
        auVar37 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar45 = vsubps_avx(auVar40,auVar56);
        auVar43 = vsubps_avx(auVar37,(undefined1  [16])0x0);
        auVar168._0_4_ = auVar45._0_4_ + auVar43._0_4_;
        auVar168._4_4_ = auVar45._4_4_ + auVar43._4_4_;
        auVar168._8_4_ = auVar45._8_4_ + auVar43._8_4_;
        auVar168._12_4_ = auVar45._12_4_ + auVar43._12_4_;
        auVar45 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar43 = vshufps_avx(auVar151,auVar151,0xb1);
        auVar42 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar220._4_4_ = auVar168._0_4_;
        auVar220._0_4_ = auVar168._0_4_;
        auVar220._8_4_ = auVar168._0_4_;
        auVar220._12_4_ = auVar168._0_4_;
        auVar39 = vshufps_avx(auVar168,auVar168,0x55);
        fVar93 = auVar39._0_4_;
        auVar179._0_4_ = auVar45._0_4_ * fVar93;
        fVar196 = auVar39._4_4_;
        auVar179._4_4_ = auVar45._4_4_ * fVar196;
        fVar198 = auVar39._8_4_;
        auVar179._8_4_ = auVar45._8_4_ * fVar198;
        fVar200 = auVar39._12_4_;
        auVar179._12_4_ = auVar45._12_4_ * fVar200;
        auVar187._0_4_ = auVar43._0_4_ * fVar93;
        auVar187._4_4_ = auVar43._4_4_ * fVar196;
        auVar187._8_4_ = auVar43._8_4_ * fVar198;
        auVar187._12_4_ = auVar43._12_4_ * fVar200;
        auVar206._0_4_ = auVar42._0_4_ * fVar93;
        auVar206._4_4_ = auVar42._4_4_ * fVar196;
        auVar206._8_4_ = auVar42._8_4_ * fVar198;
        auVar206._12_4_ = auVar42._12_4_ * fVar200;
        auVar169._0_4_ = auVar41._0_4_ * fVar93;
        auVar169._4_4_ = auVar41._4_4_ * fVar196;
        auVar169._8_4_ = auVar41._8_4_ * fVar198;
        auVar169._12_4_ = auVar41._12_4_ * fVar200;
        auVar45 = vfmadd231ps_fma(auVar179,auVar220,auVar56);
        auVar43 = vfmadd231ps_fma(auVar187,auVar220,auVar151);
        auVar50 = vfmadd231ps_fma(auVar206,auVar220,auVar52);
        auVar51 = vfmadd231ps_fma(auVar169,(undefined1  [16])0x0,auVar220);
        auVar39 = vshufpd_avx(auVar45,auVar45,1);
        auVar49 = vshufpd_avx(auVar43,auVar43,1);
        auVar47 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar48 = vshufpd_avx512vl(auVar51,auVar51,1);
        in_ZMM17 = ZEXT1664(auVar48);
        auVar42 = vminss_avx(auVar45,auVar43);
        auVar45 = vmaxss_avx(auVar43,auVar45);
        auVar41 = vminss_avx(auVar50,auVar51);
        auVar43 = vmaxss_avx(auVar51,auVar50);
        auVar42 = vminss_avx(auVar42,auVar41);
        auVar45 = vmaxss_avx(auVar43,auVar45);
        auVar41 = vminss_avx(auVar39,auVar49);
        auVar43 = vmaxss_avx(auVar49,auVar39);
        auVar39 = vminss_avx512f(auVar47,auVar48);
        auVar49 = vmaxss_avx512f(auVar48,auVar47);
        auVar43 = vmaxss_avx(auVar49,auVar43);
        auVar41 = vminss_avx512f(auVar41,auVar39);
        fVar196 = auVar43._0_4_;
        fVar93 = auVar45._0_4_;
        if (auVar42._0_4_ < 0.0001) {
          bVar35 = fVar196 == -0.0001;
          bVar32 = NAN(fVar196);
          if (fVar196 <= -0.0001) goto LAB_019c1084;
          break;
        }
LAB_019c1084:
        vucomiss_avx512f(auVar41);
        bVar35 = fVar196 <= -0.0001;
        bVar33 = -0.0001 < fVar93;
        bVar32 = bVar35;
        if (!bVar35) break;
        uVar9 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar10 = vcmpps_avx512vl(auVar41,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar21 = (byte)uVar9 & (byte)uVar10 & 1;
        bVar35 = bVar33 && bVar21 == 0;
        bVar32 = bVar33 && bVar21 == 0;
      } while (!bVar33 || bVar21 != 0);
      auVar50 = vxorps_avx512vl(auVar235._0_16_,auVar235._0_16_);
      vcmpss_avx512f(auVar42,auVar50,1);
      uVar9 = vcmpss_avx512f(auVar45,auVar50,1);
      bVar33 = (bool)((byte)uVar9 & 1);
      auVar74._0_16_ = auVar238._0_16_;
      auVar82._4_28_ = auVar74._4_28_;
      auVar82._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar238._0_4_);
      vucomiss_avx512f(auVar82._0_16_);
      bVar32 = (bool)(!bVar35 | bVar32);
      bVar33 = bVar32 == false;
      auVar84._16_16_ = auVar74._16_16_;
      auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar83._4_28_ = auVar84._4_28_;
      auVar83._0_4_ = (uint)bVar32 * auVar50._0_4_ + (uint)!bVar32 * 0x7f800000;
      auVar49 = auVar83._0_16_;
      auVar86._16_16_ = auVar74._16_16_;
      auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (uint)bVar32 * auVar50._0_4_ + (uint)!bVar32 * -0x800000;
      auVar39 = auVar85._0_16_;
      auVar51 = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
      auVar237 = ZEXT1664(auVar51);
      uVar9 = vcmpss_avx512f(auVar41,auVar50,1);
      bVar35 = (bool)((byte)uVar9 & 1);
      auVar88._16_16_ = auVar74._16_16_;
      auVar88._0_16_ = auVar238._0_16_;
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar238._0_4_);
      auVar41 = vucomiss_avx512f(auVar87._0_16_);
      in_ZMM17 = ZEXT1664(auVar41);
      if ((bVar32) || (bVar33)) {
        auVar41 = vucomiss_avx512f(auVar42);
        if ((bVar32) || (bVar33)) {
          auVar50 = vxorps_avx512vl(auVar42,auVar230._0_16_);
          in_ZMM17 = ZEXT1664(auVar50);
          auVar42 = vsubss_avx512f(auVar41,auVar42);
          auVar42 = vdivss_avx512f(auVar50,auVar42);
          auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
          auVar41 = vfmadd213ss_avx512f(auVar41,auVar51,auVar42);
          auVar42 = auVar41;
        }
        else {
          auVar42 = vxorps_avx512vl(auVar41,auVar41);
          vucomiss_avx512f(auVar42);
          auVar41 = ZEXT416(0x3f800000);
          if ((bVar32) || (bVar33)) {
            auVar41 = SUB6416(ZEXT464(0xff800000),0);
            auVar42 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar49 = vminss_avx512f(auVar49,auVar42);
        auVar39 = vmaxss_avx(auVar41,auVar39);
      }
      auVar238 = ZEXT464(0x3f800000);
      auVar235 = ZEXT1664(local_308);
      uVar9 = vcmpss_avx512f(auVar43,auVar51,1);
      bVar35 = (bool)((byte)uVar9 & 1);
      auVar43 = auVar238._0_16_;
      fVar198 = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * 0x3f800000);
      if ((auVar82._0_4_ != fVar198) || (NAN(auVar82._0_4_) || NAN(fVar198))) {
        if ((fVar196 != fVar93) || (NAN(fVar196) || NAN(fVar93))) {
          auVar45 = vxorps_avx512vl(auVar45,auVar230._0_16_);
          auVar170._0_4_ = auVar45._0_4_ / (fVar196 - fVar93);
          auVar170._4_12_ = auVar45._4_12_;
          auVar45 = vsubss_avx512f(auVar43,auVar170);
          auVar45 = vfmadd213ss_avx512f(auVar45,auVar51,auVar170);
          auVar42 = auVar45;
        }
        else if ((fVar93 != 0.0) ||
                (auVar45 = auVar43, auVar42 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar93))) {
          auVar45 = SUB6416(ZEXT464(0xff800000),0);
          auVar42 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar49 = vminss_avx(auVar49,auVar42);
        auVar39 = vmaxss_avx(auVar45,auVar39);
      }
      bVar35 = auVar87._0_4_ != fVar198;
      auVar45 = vminss_avx512f(auVar49,auVar43);
      auVar90._16_16_ = auVar74._16_16_;
      auVar90._0_16_ = auVar49;
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar35 * auVar45._0_4_ + (uint)!bVar35 * auVar49._0_4_;
      auVar45 = vmaxss_avx512f(auVar43,auVar39);
      auVar92._16_16_ = auVar74._16_16_;
      auVar92._0_16_ = auVar39;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar35 * auVar45._0_4_ + (uint)!bVar35 * auVar39._0_4_;
      auVar45 = vmaxss_avx512f(auVar51,auVar89._0_16_);
      auVar42 = vminss_avx512f(auVar91._0_16_,auVar43);
    } while (auVar42._0_4_ < auVar45._0_4_);
    auVar50 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar45._0_4_ + -0.1)));
    auVar48 = vminss_avx512f(ZEXT416((uint)(auVar42._0_4_ + 0.1)),auVar43);
    auVar110._0_8_ = auVar56._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar188._8_8_ = auVar151._0_8_;
    auVar188._0_8_ = auVar151._0_8_;
    auVar207._8_8_ = auVar52._0_8_;
    auVar207._0_8_ = auVar52._0_8_;
    auVar45 = vshufpd_avx(auVar151,auVar151,3);
    auVar42 = vshufpd_avx(auVar52,auVar52,3);
    auVar41 = vshufps_avx(auVar50,auVar48,0);
    auVar52 = vsubps_avx512vl(auVar44,auVar41);
    fVar93 = auVar41._0_4_;
    auVar143._0_4_ = fVar93 * auVar40._0_4_;
    fVar196 = auVar41._4_4_;
    auVar143._4_4_ = fVar196 * auVar40._4_4_;
    fVar198 = auVar41._8_4_;
    auVar143._8_4_ = fVar198 * auVar40._8_4_;
    fVar200 = auVar41._12_4_;
    auVar143._12_4_ = fVar200 * auVar40._12_4_;
    auVar152._0_4_ = fVar93 * auVar45._0_4_;
    auVar152._4_4_ = fVar196 * auVar45._4_4_;
    auVar152._8_4_ = fVar198 * auVar45._8_4_;
    auVar152._12_4_ = fVar200 * auVar45._12_4_;
    auVar223._0_4_ = auVar42._0_4_ * fVar93;
    auVar223._4_4_ = auVar42._4_4_ * fVar196;
    auVar223._8_4_ = auVar42._8_4_ * fVar198;
    auVar223._12_4_ = auVar42._12_4_ * fVar200;
    auVar134._0_4_ = fVar93 * auVar37._0_4_;
    auVar134._4_4_ = fVar196 * auVar37._4_4_;
    auVar134._8_4_ = fVar198 * auVar37._8_4_;
    auVar134._12_4_ = fVar200 * auVar37._12_4_;
    auVar37 = vfmadd231ps_fma(auVar143,auVar52,auVar110);
    auVar39 = vfmadd231ps_fma(auVar152,auVar52,auVar188);
    auVar49 = vfmadd231ps_fma(auVar223,auVar52,auVar207);
    auVar52 = vfmadd231ps_fma(auVar134,auVar52,ZEXT816(0));
    auVar42 = vsubss_avx512f(auVar43,auVar50);
    auVar45 = vmovshdup_avx(auVar38);
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * auVar50._0_4_)),auVar38,auVar42);
    auVar42 = vsubss_avx512f(auVar43,auVar48);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * auVar48._0_4_)),auVar38,auVar42);
    auVar38 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar203));
    auVar45 = vsubps_avx(auVar39,auVar37);
    auVar41 = vmulps_avx512vl(auVar45,auVar46);
    auVar45 = vsubps_avx(auVar49,auVar39);
    auVar40 = vmulps_avx512vl(auVar45,auVar46);
    auVar45 = vsubps_avx(auVar52,auVar49);
    auVar45 = vmulps_avx512vl(auVar45,auVar46);
    auVar42 = vminps_avx(auVar40,auVar45);
    auVar45 = vmaxps_avx(auVar40,auVar45);
    auVar42 = vminps_avx(auVar41,auVar42);
    auVar45 = vmaxps_avx(auVar41,auVar45);
    auVar41 = vshufpd_avx(auVar42,auVar42,3);
    auVar40 = vshufpd_avx(auVar45,auVar45,3);
    auVar42 = vminps_avx(auVar42,auVar41);
    auVar45 = vmaxps_avx(auVar45,auVar40);
    fVar203 = auVar38._0_4_;
    auVar171._0_4_ = auVar42._0_4_ * fVar203;
    auVar171._4_4_ = auVar42._4_4_ * fVar203;
    auVar171._8_4_ = auVar42._8_4_ * fVar203;
    auVar171._12_4_ = auVar42._12_4_ * fVar203;
    auVar160._0_4_ = fVar203 * auVar45._0_4_;
    auVar160._4_4_ = fVar203 * auVar45._4_4_;
    auVar160._8_4_ = fVar203 * auVar45._8_4_;
    auVar160._12_4_ = fVar203 * auVar45._12_4_;
    auVar50 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar48._0_4_ - auVar47._0_4_)));
    auVar45 = vshufpd_avx(auVar37,auVar37,3);
    auVar42 = vshufpd_avx(auVar39,auVar39,3);
    auVar41 = vshufpd_avx(auVar49,auVar49,3);
    auVar40 = vshufpd_avx(auVar52,auVar52,3);
    auVar45 = vsubps_avx(auVar45,auVar37);
    auVar37 = vsubps_avx(auVar42,auVar39);
    auVar38 = vsubps_avx(auVar41,auVar49);
    auVar40 = vsubps_avx(auVar40,auVar52);
    auVar42 = vminps_avx(auVar45,auVar37);
    auVar45 = vmaxps_avx(auVar45,auVar37);
    auVar41 = vminps_avx(auVar38,auVar40);
    auVar41 = vminps_avx(auVar42,auVar41);
    auVar42 = vmaxps_avx(auVar38,auVar40);
    auVar45 = vmaxps_avx(auVar45,auVar42);
    fVar203 = auVar50._0_4_;
    auVar208._0_4_ = fVar203 * auVar41._0_4_;
    auVar208._4_4_ = fVar203 * auVar41._4_4_;
    auVar208._8_4_ = fVar203 * auVar41._8_4_;
    auVar208._12_4_ = fVar203 * auVar41._12_4_;
    auVar189._0_4_ = fVar203 * auVar45._0_4_;
    auVar189._4_4_ = fVar203 * auVar45._4_4_;
    auVar189._8_4_ = fVar203 * auVar45._8_4_;
    auVar189._12_4_ = fVar203 * auVar45._12_4_;
    auVar40 = vinsertps_avx(auVar36,auVar47,0x10);
    auVar53 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9f90,auVar48);
    auVar100._0_4_ = auVar40._0_4_ + auVar53._0_4_;
    auVar100._4_4_ = auVar40._4_4_ + auVar53._4_4_;
    auVar100._8_4_ = auVar40._8_4_ + auVar53._8_4_;
    auVar100._12_4_ = auVar40._12_4_ + auVar53._12_4_;
    auVar13._8_4_ = 0x3f000000;
    auVar13._0_8_ = 0x3f0000003f000000;
    auVar13._12_4_ = 0x3f000000;
    auVar52 = vmulps_avx512vl(auVar100,auVar13);
    auVar42 = vshufps_avx(auVar52,auVar52,0x54);
    uVar94 = auVar52._0_4_;
    auVar103._4_4_ = uVar94;
    auVar103._0_4_ = uVar94;
    auVar103._8_4_ = uVar94;
    auVar103._12_4_ = uVar94;
    auVar38 = vfmadd213ps_avx512vl(auVar236._0_16_,auVar103,local_308);
    auVar41 = vfmadd213ps_fma(local_e8,auVar103,local_268);
    auVar37 = vfmadd213ps_fma(local_f8,auVar103,local_278);
    auVar45 = vsubps_avx(auVar41,auVar38);
    auVar38 = vfmadd213ps_fma(auVar45,auVar103,auVar38);
    auVar45 = vsubps_avx(auVar37,auVar41);
    auVar45 = vfmadd213ps_fma(auVar45,auVar103,auVar41);
    auVar45 = vsubps_avx(auVar45,auVar38);
    auVar41 = vfmadd231ps_fma(auVar38,auVar45,auVar103);
    auVar39 = vmulps_avx512vl(auVar45,auVar46);
    auVar215._8_8_ = auVar41._0_8_;
    auVar215._0_8_ = auVar41._0_8_;
    auVar45 = vshufpd_avx(auVar41,auVar41,3);
    auVar41 = vshufps_avx(auVar52,auVar52,0x55);
    auVar37 = vsubps_avx(auVar45,auVar215);
    auVar38 = vfmadd231ps_fma(auVar215,auVar41,auVar37);
    auVar224._8_8_ = auVar39._0_8_;
    auVar224._0_8_ = auVar39._0_8_;
    auVar45 = vshufpd_avx(auVar39,auVar39,3);
    auVar45 = vsubps_avx512vl(auVar45,auVar224);
    auVar45 = vfmadd213ps_avx512vl(auVar45,auVar41,auVar224);
    auVar104._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
    auVar104._8_4_ = auVar37._8_4_ ^ 0x80000000;
    auVar104._12_4_ = auVar37._12_4_ ^ 0x80000000;
    auVar41 = vmovshdup_avx512vl(auVar45);
    auVar225._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
    auVar225._8_4_ = auVar41._8_4_ ^ 0x80000000;
    auVar225._12_4_ = auVar41._12_4_ ^ 0x80000000;
    auVar39 = vmovshdup_avx512vl(auVar37);
    auVar49 = vpermt2ps_avx512vl(auVar225,ZEXT416(5),auVar37);
    auVar235 = ZEXT1664(local_308);
    auVar41 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar37._0_4_)),auVar45,auVar39);
    auVar37 = vpermt2ps_avx512vl(auVar45,SUB6416(ZEXT464(4),0),auVar104);
    auVar135._0_4_ = auVar41._0_4_;
    auVar135._4_4_ = auVar135._0_4_;
    auVar135._8_4_ = auVar135._0_4_;
    auVar135._12_4_ = auVar135._0_4_;
    auVar45 = vdivps_avx(auVar49,auVar135);
    auVar54 = vdivps_avx512vl(auVar37,auVar135);
    fVar203 = auVar38._0_4_;
    auVar41 = vshufps_avx(auVar38,auVar38,0x55);
    auVar216._0_4_ = fVar203 * auVar45._0_4_ + auVar41._0_4_ * auVar54._0_4_;
    auVar216._4_4_ = fVar203 * auVar45._4_4_ + auVar41._4_4_ * auVar54._4_4_;
    auVar216._8_4_ = fVar203 * auVar45._8_4_ + auVar41._8_4_ * auVar54._8_4_;
    auVar216._12_4_ = fVar203 * auVar45._12_4_ + auVar41._12_4_ * auVar54._12_4_;
    auVar50 = vsubps_avx(auVar42,auVar216);
    auVar41 = vmovshdup_avx(auVar45);
    auVar42 = vinsertps_avx(auVar171,auVar208,0x1c);
    auVar226._0_4_ = auVar41._0_4_ * auVar42._0_4_;
    auVar226._4_4_ = auVar41._4_4_ * auVar42._4_4_;
    auVar226._8_4_ = auVar41._8_4_ * auVar42._8_4_;
    auVar226._12_4_ = auVar41._12_4_ * auVar42._12_4_;
    auVar56 = vinsertps_avx512f(auVar160,auVar189,0x1c);
    auVar41 = vmulps_avx512vl(auVar41,auVar56);
    auVar49 = vminps_avx512vl(auVar226,auVar41);
    auVar38 = vmaxps_avx(auVar41,auVar226);
    auVar39 = vmovshdup_avx(auVar54);
    auVar41 = vinsertps_avx(auVar208,auVar171,0x4c);
    auVar209._0_4_ = auVar39._0_4_ * auVar41._0_4_;
    auVar209._4_4_ = auVar39._4_4_ * auVar41._4_4_;
    auVar209._8_4_ = auVar39._8_4_ * auVar41._8_4_;
    auVar209._12_4_ = auVar39._12_4_ * auVar41._12_4_;
    auVar37 = vinsertps_avx(auVar189,auVar160,0x4c);
    auVar190._0_4_ = auVar39._0_4_ * auVar37._0_4_;
    auVar190._4_4_ = auVar39._4_4_ * auVar37._4_4_;
    auVar190._8_4_ = auVar39._8_4_ * auVar37._8_4_;
    auVar190._12_4_ = auVar39._12_4_ * auVar37._12_4_;
    auVar39 = vminps_avx(auVar209,auVar190);
    auVar49 = vaddps_avx512vl(auVar49,auVar39);
    auVar39 = vmaxps_avx(auVar190,auVar209);
    auVar191._0_4_ = auVar38._0_4_ + auVar39._0_4_;
    auVar191._4_4_ = auVar38._4_4_ + auVar39._4_4_;
    auVar191._8_4_ = auVar38._8_4_ + auVar39._8_4_;
    auVar191._12_4_ = auVar38._12_4_ + auVar39._12_4_;
    auVar210._8_8_ = 0x3f80000000000000;
    auVar210._0_8_ = 0x3f80000000000000;
    auVar38 = vsubps_avx(auVar210,auVar191);
    auVar39 = vsubps_avx(auVar210,auVar49);
    auVar49 = vsubps_avx(auVar40,auVar52);
    auVar52 = vsubps_avx(auVar53,auVar52);
    fVar200 = auVar49._0_4_;
    auVar227._0_4_ = fVar200 * auVar38._0_4_;
    fVar201 = auVar49._4_4_;
    auVar227._4_4_ = fVar201 * auVar38._4_4_;
    fVar202 = auVar49._8_4_;
    auVar227._8_4_ = fVar202 * auVar38._8_4_;
    fVar99 = auVar49._12_4_;
    auVar227._12_4_ = fVar99 * auVar38._12_4_;
    auVar55 = vbroadcastss_avx512vl(auVar45);
    auVar42 = vmulps_avx512vl(auVar55,auVar42);
    auVar56 = vmulps_avx512vl(auVar55,auVar56);
    auVar55 = vminps_avx512vl(auVar42,auVar56);
    auVar56 = vmaxps_avx512vl(auVar56,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar54);
    auVar41 = vmulps_avx512vl(auVar42,auVar41);
    auVar42 = vmulps_avx512vl(auVar42,auVar37);
    auVar37 = vminps_avx512vl(auVar41,auVar42);
    auVar37 = vaddps_avx512vl(auVar55,auVar37);
    auVar49 = vmulps_avx512vl(auVar49,auVar39);
    in_ZMM17 = ZEXT1664(auVar49);
    fVar203 = auVar52._0_4_;
    auVar192._0_4_ = fVar203 * auVar38._0_4_;
    fVar93 = auVar52._4_4_;
    auVar192._4_4_ = fVar93 * auVar38._4_4_;
    fVar196 = auVar52._8_4_;
    auVar192._8_4_ = fVar196 * auVar38._8_4_;
    fVar198 = auVar52._12_4_;
    auVar192._12_4_ = fVar198 * auVar38._12_4_;
    auVar211._0_4_ = fVar203 * auVar39._0_4_;
    auVar211._4_4_ = fVar93 * auVar39._4_4_;
    auVar211._8_4_ = fVar196 * auVar39._8_4_;
    auVar211._12_4_ = fVar198 * auVar39._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar41);
    auVar161._0_4_ = auVar56._0_4_ + auVar42._0_4_;
    auVar161._4_4_ = auVar56._4_4_ + auVar42._4_4_;
    auVar161._8_4_ = auVar56._8_4_ + auVar42._8_4_;
    auVar161._12_4_ = auVar56._12_4_ + auVar42._12_4_;
    auVar172._8_8_ = 0x3f800000;
    auVar172._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar172,auVar161);
    auVar41 = vsubps_avx512vl(auVar172,auVar37);
    auVar221._0_4_ = fVar200 * auVar42._0_4_;
    auVar221._4_4_ = fVar201 * auVar42._4_4_;
    auVar221._8_4_ = fVar202 * auVar42._8_4_;
    auVar221._12_4_ = fVar99 * auVar42._12_4_;
    auVar217._0_4_ = fVar200 * auVar41._0_4_;
    auVar217._4_4_ = fVar201 * auVar41._4_4_;
    auVar217._8_4_ = fVar202 * auVar41._8_4_;
    auVar217._12_4_ = fVar99 * auVar41._12_4_;
    auVar162._0_4_ = fVar203 * auVar42._0_4_;
    auVar162._4_4_ = fVar93 * auVar42._4_4_;
    auVar162._8_4_ = fVar196 * auVar42._8_4_;
    auVar162._12_4_ = fVar198 * auVar42._12_4_;
    auVar173._0_4_ = fVar203 * auVar41._0_4_;
    auVar173._4_4_ = fVar93 * auVar41._4_4_;
    auVar173._8_4_ = fVar196 * auVar41._8_4_;
    auVar173._12_4_ = fVar198 * auVar41._12_4_;
    auVar42 = vminps_avx(auVar221,auVar217);
    auVar41 = vminps_avx512vl(auVar162,auVar173);
    auVar37 = vminps_avx512vl(auVar42,auVar41);
    auVar42 = vmaxps_avx(auVar217,auVar221);
    auVar41 = vmaxps_avx(auVar173,auVar162);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    auVar38 = vminps_avx512vl(auVar227,auVar49);
    auVar42 = vminps_avx(auVar192,auVar211);
    auVar42 = vminps_avx(auVar38,auVar42);
    auVar42 = vhaddps_avx(auVar37,auVar42);
    auVar38 = vmaxps_avx512vl(auVar49,auVar227);
    auVar37 = vmaxps_avx(auVar211,auVar192);
    auVar37 = vmaxps_avx(auVar37,auVar38);
    auVar41 = vhaddps_avx(auVar41,auVar37);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar163._0_4_ = auVar42._0_4_ + auVar50._0_4_;
    auVar163._4_4_ = auVar42._4_4_ + auVar50._4_4_;
    auVar163._8_4_ = auVar42._8_4_ + auVar50._8_4_;
    auVar163._12_4_ = auVar42._12_4_ + auVar50._12_4_;
    auVar174._0_4_ = auVar41._0_4_ + auVar50._0_4_;
    auVar174._4_4_ = auVar41._4_4_ + auVar50._4_4_;
    auVar174._8_4_ = auVar41._8_4_ + auVar50._8_4_;
    auVar174._12_4_ = auVar41._12_4_ + auVar50._12_4_;
    auVar42 = vmaxps_avx(auVar40,auVar163);
    auVar41 = vminps_avx(auVar174,auVar53);
    uVar30 = vcmpps_avx512vl(auVar41,auVar42,1);
  } while ((uVar30 & 3) != 0);
  uVar30 = vcmpps_avx512vl(auVar174,auVar53,1);
  uVar9 = vcmpps_avx512vl(auVar36,auVar163,1);
  if (((ushort)uVar9 & (ushort)uVar30 & 1) == 0) {
    bVar21 = 0;
  }
  else {
    auVar42 = vmovshdup_avx(auVar163);
    bVar21 = auVar47._0_4_ < auVar42._0_4_ & (byte)(uVar30 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar27 || uVar4 != 0 && !bVar34) | bVar21) != 1) goto LAB_019c1c6c;
  lVar24 = 0xc9;
  do {
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) goto LAB_019c0e59;
    auVar36 = vsubss_avx512f(auVar43,auVar50);
    fVar196 = auVar36._0_4_;
    fVar203 = fVar196 * fVar196 * fVar196;
    fVar198 = auVar50._0_4_;
    fVar93 = fVar198 * 3.0 * fVar196 * fVar196;
    fVar196 = fVar196 * fVar198 * fVar198 * 3.0;
    auVar122._4_4_ = fVar203;
    auVar122._0_4_ = fVar203;
    auVar122._8_4_ = fVar203;
    auVar122._12_4_ = fVar203;
    auVar111._4_4_ = fVar93;
    auVar111._0_4_ = fVar93;
    auVar111._8_4_ = fVar93;
    auVar111._12_4_ = fVar93;
    auVar96._4_4_ = fVar196;
    auVar96._0_4_ = fVar196;
    auVar96._8_4_ = fVar196;
    auVar96._12_4_ = fVar196;
    fVar198 = fVar198 * fVar198 * fVar198;
    auVar144._0_4_ = (float)local_108._0_4_ * fVar198;
    auVar144._4_4_ = (float)local_108._4_4_ * fVar198;
    auVar144._8_4_ = fStack_100 * fVar198;
    auVar144._12_4_ = fStack_fc * fVar198;
    auVar36 = vfmadd231ps_fma(auVar144,local_278,auVar96);
    auVar36 = vfmadd231ps_fma(auVar36,local_268,auVar111);
    auVar36 = vfmadd231ps_avx512vl(auVar36,local_308,auVar122);
    auVar97._8_8_ = auVar36._0_8_;
    auVar97._0_8_ = auVar36._0_8_;
    auVar36 = vshufpd_avx(auVar36,auVar36,3);
    auVar42 = vshufps_avx(auVar50,auVar50,0x55);
    auVar36 = vsubps_avx(auVar36,auVar97);
    auVar42 = vfmadd213ps_fma(auVar36,auVar42,auVar97);
    fVar203 = auVar42._0_4_;
    auVar36 = vshufps_avx(auVar42,auVar42,0x55);
    auVar98._0_4_ = auVar45._0_4_ * fVar203 + auVar54._0_4_ * auVar36._0_4_;
    auVar98._4_4_ = auVar45._4_4_ * fVar203 + auVar54._4_4_ * auVar36._4_4_;
    auVar98._8_4_ = auVar45._8_4_ * fVar203 + auVar54._8_4_ * auVar36._8_4_;
    auVar98._12_4_ = auVar45._12_4_ * fVar203 + auVar54._12_4_ * auVar36._12_4_;
    auVar50 = vsubps_avx(auVar50,auVar98);
    auVar36 = vandps_avx512vl(auVar42,auVar229._0_16_);
    auVar42 = vprolq_avx512vl(auVar36,0x20);
    auVar36 = vmaxss_avx(auVar42,auVar36);
    bVar34 = (float)local_118._0_4_ < auVar36._0_4_;
  } while ((float)local_118._0_4_ <= auVar36._0_4_);
  auVar36 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_019c0e59;
  auVar45 = vucomiss_avx512f(auVar36);
  auVar238 = ZEXT1664(auVar45);
  if (bVar34) goto LAB_019c0e59;
  vmovshdup_avx(auVar36);
  auVar45 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_019c0e59;
  auVar43 = vucomiss_avx512f(auVar45);
  auVar238 = ZEXT1664(auVar43);
  if (bVar34) goto LAB_019c0e59;
  auVar42 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar52 = vinsertps_avx(auVar42,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->org).field_0;
  auVar42 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar42 = vdpps_avx(auVar42,auVar52,0x7f);
  auVar41 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar41 = vdpps_avx(auVar41,auVar52,0x7f);
  auVar40 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar40 = vdpps_avx(auVar40,auVar52,0x7f);
  auVar37 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar37 = vdpps_avx(auVar37,auVar52,0x7f);
  auVar38 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar38 = vdpps_avx(auVar38,auVar52,0x7f);
  auVar39 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar39 = vdpps_avx(auVar39,auVar52,0x7f);
  auVar49 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar49 = vdpps_avx(auVar49,auVar52,0x7f);
  auVar50 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar52 = vdpps_avx(auVar50,auVar52,0x7f);
  auVar50 = vsubss_avx512f(auVar43,auVar45);
  fVar203 = auVar45._0_4_;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar203)),auVar50,auVar42);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar203)),auVar50,auVar41);
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar203)),auVar50,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar52._0_4_)),auVar50,auVar37);
  auVar43 = vsubss_avx512f(auVar43,auVar36);
  auVar145._0_4_ = auVar43._0_4_;
  fVar203 = auVar145._0_4_ * auVar145._0_4_ * auVar145._0_4_;
  fVar200 = auVar36._0_4_;
  fVar93 = fVar200 * 3.0 * auVar145._0_4_ * auVar145._0_4_;
  fVar196 = auVar145._0_4_ * fVar200 * fVar200 * 3.0;
  fVar201 = fVar200 * fVar200 * fVar200;
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar40._0_4_)),ZEXT416((uint)fVar196),auVar41)
  ;
  auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar93),auVar42);
  auVar45 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar203),auVar45);
  fVar198 = auVar45._0_4_;
  if ((fVar198 < (ray->org).field_0.m128[3]) || (fVar202 = ray->tfar, fVar202 < fVar198))
  goto LAB_019c0e59;
  auVar45 = vshufps_avx(auVar36,auVar36,0x55);
  auVar42 = vsubps_avx512vl(auVar44,auVar45);
  fVar99 = auVar45._0_4_;
  auVar175._0_4_ = fVar99 * (float)local_1b8._0_4_;
  fVar101 = auVar45._4_4_;
  auVar175._4_4_ = fVar101 * (float)local_1b8._4_4_;
  fVar115 = auVar45._8_4_;
  auVar175._8_4_ = fVar115 * fStack_1b0;
  fVar116 = auVar45._12_4_;
  auVar175._12_4_ = fVar116 * fStack_1ac;
  auVar180._0_4_ = fVar99 * (float)local_208._0_4_;
  auVar180._4_4_ = fVar101 * (float)local_208._4_4_;
  auVar180._8_4_ = fVar115 * fStack_200;
  auVar180._12_4_ = fVar116 * fStack_1fc;
  auVar193._0_4_ = fVar99 * (float)local_218._0_4_;
  auVar193._4_4_ = fVar101 * (float)local_218._4_4_;
  auVar193._8_4_ = fVar115 * fStack_210;
  auVar193._12_4_ = fVar116 * fStack_20c;
  auVar153._0_4_ = fVar99 * (float)local_1d8._0_4_;
  auVar153._4_4_ = fVar101 * (float)local_1d8._4_4_;
  auVar153._8_4_ = fVar115 * fStack_1d0;
  auVar153._12_4_ = fVar116 * fStack_1cc;
  auVar45 = vfmadd231ps_fma(auVar175,auVar42,local_1a8);
  auVar44 = vfmadd231ps_fma(auVar180,auVar42,local_1e8);
  auVar43 = vfmadd231ps_fma(auVar193,auVar42,local_1f8);
  auVar42 = vfmadd231ps_fma(auVar153,auVar42,local_1c8);
  auVar45 = vsubps_avx(auVar44,auVar45);
  auVar44 = vsubps_avx(auVar43,auVar44);
  auVar43 = vsubps_avx(auVar42,auVar43);
  auVar194._0_4_ = fVar200 * auVar44._0_4_;
  auVar194._4_4_ = fVar200 * auVar44._4_4_;
  auVar194._8_4_ = fVar200 * auVar44._8_4_;
  auVar194._12_4_ = fVar200 * auVar44._12_4_;
  auVar145._4_4_ = auVar145._0_4_;
  auVar145._8_4_ = auVar145._0_4_;
  auVar145._12_4_ = auVar145._0_4_;
  auVar45 = vfmadd231ps_fma(auVar194,auVar145,auVar45);
  auVar154._0_4_ = fVar200 * auVar43._0_4_;
  auVar154._4_4_ = fVar200 * auVar43._4_4_;
  auVar154._8_4_ = fVar200 * auVar43._8_4_;
  auVar154._12_4_ = fVar200 * auVar43._12_4_;
  auVar44 = vfmadd231ps_fma(auVar154,auVar145,auVar44);
  auVar155._0_4_ = fVar200 * auVar44._0_4_;
  auVar155._4_4_ = fVar200 * auVar44._4_4_;
  auVar155._8_4_ = fVar200 * auVar44._8_4_;
  auVar155._12_4_ = fVar200 * auVar44._12_4_;
  auVar45 = vfmadd231ps_fma(auVar155,auVar145,auVar45);
  auVar46 = vmulps_avx512vl(auVar45,auVar46);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar21 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019c1c64;
    auVar136._0_4_ = fVar201 * (float)local_158._0_4_;
    auVar136._4_4_ = fVar201 * (float)local_158._4_4_;
    auVar136._8_4_ = fVar201 * fStack_150;
    auVar136._12_4_ = fVar201 * fStack_14c;
    auVar123._4_4_ = fVar196;
    auVar123._0_4_ = fVar196;
    auVar123._8_4_ = fVar196;
    auVar123._12_4_ = fVar196;
    auVar45 = vfmadd132ps_fma(auVar123,auVar136,local_148);
    auVar112._4_4_ = fVar93;
    auVar112._0_4_ = fVar93;
    auVar112._8_4_ = fVar93;
    auVar112._12_4_ = fVar93;
    auVar45 = vfmadd132ps_fma(auVar112,auVar45,local_138);
    auVar105._4_4_ = fVar203;
    auVar105._0_4_ = fVar203;
    auVar105._8_4_ = fVar203;
    auVar105._12_4_ = fVar203;
    auVar43 = vfmadd132ps_fma(auVar105,auVar45,local_128);
    auVar45 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar44 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar106._0_4_ = auVar43._0_4_ * auVar44._0_4_;
    auVar106._4_4_ = auVar43._4_4_ * auVar44._4_4_;
    auVar106._8_4_ = auVar43._8_4_ * auVar44._8_4_;
    auVar106._12_4_ = auVar43._12_4_ * auVar44._12_4_;
    auVar45 = vfmsub231ps_fma(auVar106,auVar46,auVar45);
    auVar46 = vshufps_avx(auVar45,auVar45,0xe9);
    local_188 = vmovlps_avx(auVar46);
    local_180 = auVar45._0_4_;
    local_17c = vmovlps_avx(auVar36);
    local_174 = (int)local_258;
    local_170 = (int)local_310;
    local_16c = context->user->instID[0];
    local_168 = context->user->instPrimID[0];
    ray->tfar = fVar198;
    local_32c = -1;
    local_248.valid = &local_32c;
    local_248.geometryUserPtr = pGVar5->userPtr;
    local_248.context = context->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019c1b97:
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var6)(&local_248);
        auVar236 = ZEXT1664(local_328);
        auVar238 = ZEXT464(0x3f800000);
        auVar234 = ZEXT3264(_DAT_01fb9fe0);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar233 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar232 = ZEXT1664(auVar36);
        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar231 = ZEXT3264(auVar62);
        auVar74._16_16_ = auVar62._16_16_;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar230 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar229 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT1664(auVar36);
        if (*local_248.valid == 0) goto LAB_019c1c56;
      }
      bVar21 = 1;
      goto LAB_019c1c64;
    }
    (*pGVar5->occlusionFilterN)(&local_248);
    auVar236 = ZEXT1664(local_328);
    auVar238 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar233 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar232 = ZEXT1664(auVar36);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar231 = ZEXT3264(auVar62);
    auVar74._16_16_ = auVar62._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar230 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar229 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar36);
    if (*local_248.valid != 0) goto LAB_019c1b97;
LAB_019c1c56:
    auVar238 = ZEXT464(0x3f800000);
    ray->tfar = fVar202;
  }
  bVar21 = 0;
LAB_019c1c64:
  bVar31 = (bool)(bVar31 | bVar21);
  goto LAB_019c0e59;
LAB_019c1c6c:
  auVar38 = vinsertps_avx(auVar47,auVar48,0x10);
  goto LAB_019c095c;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }